

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  time_t tVar6;
  GLFWwindow *handle;
  GLchar *pGVar7;
  GLchar *pGVar8;
  GLchar *pGVar9;
  size_t sVar10;
  int i;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  GLuint cursor;
  GLfloat delta_time;
  GLchar *fragCode;
  GLchar *vertCode;
  GLchar *computeCode;
  GLuint vel;
  GLuint timebuffer;
  GLuint pos;
  GLuint vao;
  GLchar infolog [512];
  vec4 velocities [100000];
  vec4 positions [100000];
  GLuint in_stack_ffffffffffcf2950;
  double in_stack_ffffffffffcf2958;
  double in_stack_ffffffffffcf2960;
  GLuint in_stack_ffffffffffcf29b8;
  GLuint in_stack_ffffffffffcf29bc;
  GLuint in_stack_ffffffffffcf29c0;
  GLuint in_stack_ffffffffffcf29c4;
  
  lVar12 = 0;
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  handle = glfwCreateWindow(0x780,0x438,"particles",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  glfwMakeContextCurrent(handle);
  glfwSwapInterval(1);
  gladLoadGL();
  memset(&stack0xffffffffffe795c8,0,1600000);
  memset(&stack0xffffffffffcf2bc8,0,1600000);
  lVar11 = 0;
  do {
    iVar1 = rand();
    dVar13 = (double)((float)iVar1 * 4.656613e-10 * 8.0);
    dVar14 = sin((double)(int)lVar11);
    dVar15 = cos((double)(int)lVar11);
    auVar16._0_8_ = dVar13 * dVar14;
    auVar16._8_8_ = dVar13 * dVar15;
    auVar16 = divpd(auVar16,_DAT_00115020);
    *(ulong *)(&stack0xffffffffffe795c8 + lVar12) =
         CONCAT44((float)auVar16._8_8_,(float)auVar16._0_8_);
    *(undefined8 *)(&stack0xffffffffffe795d0 + lVar12) = 0;
    lVar11 = lVar11 + 1;
    *(undefined8 *)(&stack0xffffffffffcf2bc8 + lVar12) = 0;
    *(undefined8 *)(&stack0xffffffffffcf2bd0 + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar11 != 100000);
  (*glad_glCreateVertexArrays)(1,(GLuint *)&stack0xffffffffffcf29c4);
  (*glad_glBindVertexArray)(in_stack_ffffffffffcf29c4);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29c0);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29bc);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29b8);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf2950);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29b8,1600000,&stack0xffffffffffcf2bc8,0x88e4);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29c0,1600000,&stack0xffffffffffe795c8,0x88e4);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29bc,4,&stack0xffffffffffcf2954,0x88e8);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf2950,8,&defaultCursor,0x88e8);
  (*glad_glBindBufferBase)(0x90d2,0,in_stack_ffffffffffcf29c0);
  (*glad_glBindBufferBase)(0x90d2,1,in_stack_ffffffffffcf29b8);
  (*glad_glBindBufferBase)(0x90d2,2,in_stack_ffffffffffcf2950);
  (*glad_glBindBufferBase)(0x90d2,3,in_stack_ffffffffffcf29bc);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"shader.vert","");
  pGVar7 = LoadShader((string *)&stack0xffffffffffcf29c8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"shader.frag","");
  pGVar8 = LoadShader((string *)&stack0xffffffffffcf29c8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"cursor.glsl","");
  pGVar9 = LoadShader((string *)&stack0xffffffffffcf29c8);
  GVar2 = (*glad_glCreateShader)(0x8b31);
  GVar3 = (*glad_glCreateShader)(0x8b30);
  GVar4 = (*glad_glCreateShader)(0x91b9);
  (*glad_glShaderSource)(GVar2,1,(GLchar **)&stack0xffffffffffcf2970,(GLint *)0x0);
  (*glad_glShaderSource)(GVar3,1,(GLchar **)&stack0xffffffffffcf2968,(GLint *)0x0);
  (*glad_glShaderSource)(GVar4,1,(GLchar **)&stack0xffffffffffcf29b0,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar10 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glCompileShader)(GVar3);
  (*glad_glGetShaderInfoLog)(GVar3,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar10 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glCompileShader)(GVar4);
  (*glad_glGetShaderInfoLog)(GVar4,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar10 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  GVar5 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar5,GVar2);
  (*glad_glAttachShader)(GVar5,GVar3);
  (*glad_glLinkProgram)(GVar5);
  (*glad_glDeleteShader)(GVar2);
  (*glad_glDeleteShader)(GVar3);
  (*glad_glGetProgramInfoLog)(GVar5,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar10 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  GVar2 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar2,GVar4);
  (*glad_glLinkProgram)(GVar2);
  (*glad_glDeleteShader)(GVar4);
  (*glad_glGetProgramInfoLog)(GVar2,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar10 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glViewport)(0,0,0x780,0x438);
  (*glad_glClearColor)(0.05,0.05,0.05,1.0);
  (*glad_glPointSize)(2.0);
  iVar1 = glfwWindowShouldClose(handle);
  while (iVar1 == 0) {
    (*glad_glClear)(0x4000);
    glfwPollEvents();
    glfwGetCursorPos(handle,(double *)&stack0xffffffffffcf2960,(double *)&stack0xffffffffffcf2958);
    auVar17._0_8_ = in_stack_ffffffffffcf2960 + -960.0;
    auVar17._8_8_ = in_stack_ffffffffffcf2958 + -540.0;
    auVar16 = divpd(auVar17,_DAT_00115040);
    in_stack_ffffffffffcf2960 = auVar16._0_8_ * 2.0;
    in_stack_ffffffffffcf2958 = auVar16._8_8_ * -2.0;
    (*glad_glNamedBufferSubData)(in_stack_ffffffffffcf2950,0,8,&stack0xffffffffffcf29a8);
    (*glad_glUseProgram)(GVar2);
    (*glad_glDispatchCompute)(100,1,1);
    (*glad_glUseProgram)(GVar5);
    (*glad_glDrawArraysInstanced)(0,0,1,100000);
    glfwSwapBuffers(handle);
    iVar1 = glfwWindowShouldClose(handle);
  }
  (*glad_glDeleteProgram)(GVar5);
  (*glad_glDeleteProgram)(GVar2);
  if (pGVar7 != (GLchar *)0x0) {
    operator_delete__(pGVar7);
  }
  if (pGVar8 != (GLchar *)0x0) {
    operator_delete__(pGVar8);
  }
  if (pGVar9 != (GLchar *)0x0) {
    operator_delete__(pGVar9);
  }
  glfwDestroyWindow(handle);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  srand(time(0));

  const GLfloat delta_time = 0.1f;

  //Window Setup
  glfwInit();

  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);

  GLFWwindow* window = glfwCreateWindow(SCREENX, SCREENY, "particles", nullptr, nullptr);
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);

  gladLoadGL();

  //Setup Initial Positions/Velocities
  glm::vec4 positions[NUM_PARTICLES];
  glm::vec4 velocities[NUM_PARTICLES];
  for(int i = 0; i < NUM_PARTICLES; i++) {
    float r = (float)rand() / RAND_MAX;
    r *= 8;
    float velx = r * sin(i) / 10;
    float vely = r * cos(i) / 10;
    positions[i] = glm::vec4(velx, vely, 0.0f, 0.0f);
    velocities[i] = glm::vec4(0.0f, 0.0f, 0.0f, 0.0f);
  }

  GLuint vao, pos, timebuffer, vel, cursor;

  /**
  * VAO Setup - Even though we'll be sourcing all of our positions from a shader storage buffer,
  * a VAO must be bound for drawing, so let's just create an empty one. We also don't need a VBO
  * since all our rendering will be points
  */
  glCreateVertexArrays(1, &vao);
  glBindVertexArray(vao);

  /**
  * Buffer setup - We'll need 4 SSBOs, one for the position of each point, one for velocity,
  * one for cursor position, and one for delta_time. As cursor and delta_time are small, these
  * could have been implemented using regular uniforms, but I opted for consistency instead
  */
  glCreateBuffers(1, &pos);
  glCreateBuffers(1, &timebuffer);
  glCreateBuffers(1, &vel);
  glCreateBuffers(1, &cursor);
  glNamedBufferData(vel, sizeof(velocities), velocities, GL_STATIC_DRAW);
  glNamedBufferData(pos, sizeof(positions), positions, GL_STATIC_DRAW);
  glNamedBufferData(timebuffer, sizeof(GLfloat), &delta_time, GL_DYNAMIC_DRAW);
  glNamedBufferData(cursor, 2 * sizeof(GLfloat), glm::value_ptr(defaultCursor), GL_DYNAMIC_DRAW);

  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, pos);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, vel);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, cursor);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, timebuffer);


  /*
  * Basic Shader Setup - This is standard shader loading and compilation. The only difference is that the compute
  * shader must be linked by itself in a separate program
  */
  const GLchar* vertCode = LoadShader("shader.vert");
  const GLchar* fragCode = LoadShader("shader.frag");
  const GLchar* computeCode = LoadShader("cursor.glsl");

  GLuint vertShader = glCreateShader(GL_VERTEX_SHADER);
  GLuint fragShader = glCreateShader(GL_FRAGMENT_SHADER);
  GLuint computeShader = glCreateShader(GL_COMPUTE_SHADER);

  glShaderSource(vertShader, 1, &vertCode, nullptr);
  glShaderSource(fragShader, 1, &fragCode, nullptr);
  glShaderSource(computeShader, 1, &computeCode, nullptr);
  GLchar infolog[512];
  glCompileShader(vertShader);
  glGetShaderInfoLog(vertShader, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  glCompileShader(fragShader);
  glGetShaderInfoLog(fragShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  glCompileShader(computeShader);
  glGetShaderInfoLog(computeShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  GLuint shaderProgram = glCreateProgram();
  glAttachShader(shaderProgram, vertShader);
  glAttachShader(shaderProgram, fragShader);
  glLinkProgram(shaderProgram);
  glDeleteShader(vertShader);
  glDeleteShader(fragShader);

  glGetProgramInfoLog(shaderProgram, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  GLuint computeProgram = glCreateProgram();
  glAttachShader(computeProgram, computeShader);
  glLinkProgram(computeProgram);
  glDeleteShader(computeShader);

  glGetProgramInfoLog(computeProgram, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  /**
  * Setup some basic properties for screen size, background color and point size
  * 2.0 Point Size was used to make it easier to see
  */
  glViewport(0, 0, SCREENX, SCREENY);
  glClearColor(0.05f, 0.05, 0.05f, 1.0f);
  glPointSize(2.0f);

  // Draw Loop
  while(glfwWindowShouldClose(window) == 0) {
    glClear(GL_COLOR_BUFFER_BIT);
    /**
    * Get our cursor coordinates in normalized device coordinates
    */
    glfwPollEvents();
    double cursorx;
    double cursory;
    glfwGetCursorPos(window, &cursorx, &cursory);

    cursorx = cursorx - (SCREENX / 2);
    cursorx /= SCREENX;
    cursorx *= 2;

    cursory = cursory - (SCREENY / 2);
    cursory /= SCREENY;
    cursory *= -2;

    /**
    * Copy over the cursor position into the buffer
    */
    glm::vec2 current_cursor = glm::vec2(cursorx, cursory);

    glNamedBufferSubData(cursor, 0, 2 * sizeof(GLfloat), glm::value_ptr(current_cursor));

    /**
    * Fire off our compute shader run. Since we want to simulate 100000 particles, and our work group size is 1000
    * we need to dispatch 100 work groups
    */
    glUseProgram(computeProgram);
    glDispatchCompute(NUM_PARTICLES / WORK_GROUP_SIZE, 1, 1);

    /**
    * Draw the particles
    */
    glUseProgram(shaderProgram);
    glDrawArraysInstanced(GL_POINTS, 0, 1, NUM_PARTICLES);


    glfwSwapBuffers(window);
  }

  /**
  * We're done now, just need to free up our resources
  */

  //OpenGL Shutdown
  glDeleteProgram(shaderProgram);
  glDeleteProgram(computeProgram);
  delete[] vertCode;
  delete[] fragCode;
  delete[] computeCode;

  //Window Shutdown
  glfwDestroyWindow(window);
  glfwTerminate();
  return 0;
}